

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen12dGPUResource_DISABLED_Test2DTile64MippedResourceOptimization_Test::TestBody
          (CTestGen12dGPUResource_DISABLED_Test2DTile64MippedResourceOptimization_Test *this)

{
  bool bVar1;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  byte bVar2;
  uint local_454;
  uint32_t local_450;
  uint32_t Mip5RenderAlignedOffset;
  uint32_t Mip5Y;
  uint32_t Mip5X;
  uint32_t Mip5Offset;
  uint32_t Mip4RenderAlignedOffset;
  uint32_t Mip4Y;
  uint32_t Mip4X;
  uint32_t Mip4Offset;
  uint32_t Mip3RenderAlignedOffset;
  uint32_t Mip3Y;
  uint32_t Mip3X;
  uint32_t Mip3Offset;
  uint32_t Mip2RenderAlignedOffset;
  uint32_t Mip2Y;
  uint32_t Mip2X;
  uint32_t Mip2Offset;
  uint32_t Mip1Offset;
  undefined8 uStack_1f8;
  uint32_t Mip0Size;
  GMM_REQ_OFFSET_INFO ReqInfo;
  uint local_188;
  uint32_t MaxHeight;
  uint32_t MipHeight;
  uint32_t MipWidth;
  GMM_RESOURCE_INFO *ResourceInfo;
  TEST_BPP bpp;
  uint32_t Mip2Width;
  uint32_t Mip1Width;
  uint32_t Mip0Width;
  uint32_t MipTailHeight;
  uint32_t Mip2Higher;
  uint32_t Mip3Height;
  uint32_t Mip2Height;
  uint32_t Mip1Height;
  uint32_t Mip0Height;
  uint32_t MipTailStartLod;
  uint32_t ExpectedPitch;
  uint32_t AlignedHeight;
  uint32_t AlignedWidth;
  uint32_t i;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t MtsHeight [5];
  uint32_t MtsWidth [5];
  undefined1 local_78 [8];
  uint32_t TileSize [5] [2];
  uint32_t VAlign [5];
  uint32_t HAlign [5];
  CTestGen12dGPUResource_DISABLED_Test2DTile64MippedResourceOptimization_Test *this_local;
  
  memcpy(local_78,&DAT_00229ff0,0x28);
  MtsWidth[0] = 0x40;
  MtsWidth[1] = 0x40;
  MtsWidth[2] = 0x20;
  gmmParams.MultiTileArch._0_1_ = 0;
  gmmParams.MultiTileArch.GpuVaMappingSet = '\x01';
  gmmParams.MultiTileArch.LocalMemEligibilitySet = '\0';
  gmmParams.MultiTileArch.LocalMemPreferredSet = '\0';
  gmmParams.MultiTileArch.Reserved = 0x80;
  memset(&AlignedWidth,0,0x80);
  AlignedWidth = 2;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffff3ffffffff | 0x400000000;
  gmmParams.BaseHeight = 5;
  gmmParams.Depth = 4;
  gmmParams.MSAA.SamplePattern = 0x33;
  for (AlignedHeight = 0; AlignedHeight < 5; AlignedHeight = AlignedHeight + 1) {
    Mip1Height = 0;
    i = CTestResource::SetResourceFormat((CTestResource *)this,AlignedHeight);
    gmmParams.CpTag = 0x120;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 0x120;
    gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffff7ffffffff;
    gmmParams.Flags.Gpu =
         (anon_struct_8_45_9b07292e_for_Gpu)((ulong)gmmParams.Flags.Gpu & 0xffffe7ffffffffff);
    ResourceInfo_00 =
         (GMM_RESOURCE_INFO *)
         (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                   (CommonULT::pGmmULTClientContext,&AlignedWidth);
    CTestResource::VerifyResourceTile4<true>((CTestResource *)this,ResourceInfo_00,true);
    MaxHeight = gmmParams.CpTag;
    local_188 = gmmParams.field_6.BaseWidth;
    while( true ) {
      bVar1 = false;
      if (MaxHeight <= MtsWidth[(ulong)AlignedHeight - 2]) {
        bVar1 = local_188 <= MtsHeight[(ulong)AlignedHeight - 2];
      }
      if (bVar1) break;
      Mip1Height = Mip1Height + 1;
      bVar2 = (byte)Mip1Height;
      if ((ulong)gmmParams._40_8_ >> (bVar2 & 0x3f) == 0) {
        local_450 = 1;
      }
      else {
        local_450 = (uint32_t)((ulong)gmmParams._40_8_ >> (bVar2 & 0x3f));
      }
      MaxHeight = local_450;
      if (gmmParams.field_6.BaseWidth >> (bVar2 & 0x1f) == 0) {
        local_454 = 1;
      }
      else {
        local_454 = gmmParams.field_6.BaseWidth >> (bVar2 & 0x1f);
      }
      local_188 = local_454;
    }
    CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
    ReqInfo.StdLayout.Offset = 0;
    ReqInfo.StdLayout.TileRowPitch = 0;
    ReqInfo.Render.XOffset = 0;
    ReqInfo.Render.YOffset = 0;
    ReqInfo.Render.ZOffset = 0;
    ReqInfo.Render._20_4_ = 0;
    ReqInfo.Lock.Pitch = 0;
    ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    ReqInfo.Render.field_0.Offset64 = 0;
    ReqInfo.Frame = GMM_DISPLAY_BASE;
    ReqInfo._28_4_ = 0;
    ReqInfo.Lock.field_0.Offset64 = 0;
    ReqInfo.MipLevel = 0;
    ReqInfo.Slice = 0;
    ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    ReqInfo.Plane = GMM_NO_PLANE;
    ReqInfo._0_4_ = 0;
    ReqInfo.ArrayIndex = 0;
    uStack_1f8 = 1;
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))();
    ReqInfo.StdLayout.Offset = 0;
    ReqInfo.StdLayout.TileRowPitch = 0;
    ReqInfo.Render.XOffset = 0;
    ReqInfo.Render.YOffset = 0;
    ReqInfo.Render.ZOffset = 0;
    ReqInfo.Render._20_4_ = 0;
    ReqInfo.Lock.Pitch = 0;
    ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    ReqInfo.Render.field_0.Offset64 = 0;
    ReqInfo.Frame = GMM_DISPLAY_BASE;
    ReqInfo._28_4_ = 0;
    ReqInfo.Lock.field_0.Offset64 = 0;
    ReqInfo.MipLevel = 0;
    ReqInfo.Slice = 0;
    ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    ReqInfo.Plane = GMM_NO_PLANE;
    ReqInfo._0_4_ = 1;
    ReqInfo.ArrayIndex = 0;
    uStack_1f8 = 1;
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&stack0xfffffffffffffe08);
    ReqInfo.StdLayout.Offset = 0;
    ReqInfo.StdLayout.TileRowPitch = 0;
    ReqInfo.Render.XOffset = 0;
    ReqInfo.Render.YOffset = 0;
    ReqInfo.Render.ZOffset = 0;
    ReqInfo.Render._20_4_ = 0;
    ReqInfo.Lock.Pitch = 0;
    ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    ReqInfo.Render.field_0.Offset64 = 0;
    ReqInfo.Frame = GMM_DISPLAY_BASE;
    ReqInfo._28_4_ = 0;
    ReqInfo.Lock.field_0.Offset64 = 0;
    ReqInfo.MipLevel = 0;
    ReqInfo.Slice = 0;
    ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    ReqInfo.Plane = GMM_NO_PLANE;
    ReqInfo._0_4_ = 2;
    ReqInfo.ArrayIndex = 0;
    uStack_1f8 = 1;
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&stack0xfffffffffffffe08);
    CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
    switch(AlignedHeight) {
    case 0:
      break;
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
    }
    ReqInfo.StdLayout.Offset = 0;
    ReqInfo.StdLayout.TileRowPitch = 0;
    ReqInfo.Render.XOffset = 0;
    ReqInfo.Render.YOffset = 0;
    ReqInfo.Render.ZOffset = 0;
    ReqInfo.Render._20_4_ = 0;
    ReqInfo.Lock.Pitch = 0;
    ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    ReqInfo.Render.field_0.Offset64 = 0;
    ReqInfo.Frame = GMM_DISPLAY_BASE;
    ReqInfo._28_4_ = 0;
    ReqInfo.Lock.field_0.Offset64 = 0;
    ReqInfo.MipLevel = 0;
    ReqInfo.Slice = 0;
    ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    ReqInfo.Plane = GMM_NO_PLANE;
    ReqInfo._0_4_ = 3;
    ReqInfo.ArrayIndex = 0;
    uStack_1f8 = 1;
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&stack0xfffffffffffffe08);
    switch(AlignedHeight) {
    case 0:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 1:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 2:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 3:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 4:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
    }
    ReqInfo.StdLayout.Offset = 0;
    ReqInfo.StdLayout.TileRowPitch = 0;
    ReqInfo.Render.XOffset = 0;
    ReqInfo.Render.YOffset = 0;
    ReqInfo.Render.ZOffset = 0;
    ReqInfo.Render._20_4_ = 0;
    ReqInfo.Lock.Pitch = 0;
    ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    ReqInfo.Render.field_0.Offset64 = 0;
    ReqInfo.Frame = GMM_DISPLAY_BASE;
    ReqInfo._28_4_ = 0;
    ReqInfo.Lock.field_0.Offset64 = 0;
    ReqInfo.MipLevel = 0;
    ReqInfo.Slice = 0;
    ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    ReqInfo.Plane = GMM_NO_PLANE;
    ReqInfo._0_4_ = 4;
    ReqInfo.ArrayIndex = 0;
    uStack_1f8 = 1;
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&stack0xfffffffffffffe08);
    switch(AlignedHeight) {
    case 0:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 1:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 2:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 3:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 4:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
    }
    ReqInfo.StdLayout.Offset = 0;
    ReqInfo.StdLayout.TileRowPitch = 0;
    ReqInfo.Render.XOffset = 0;
    ReqInfo.Render.YOffset = 0;
    ReqInfo.Render.ZOffset = 0;
    ReqInfo.Render._20_4_ = 0;
    ReqInfo.Lock.Pitch = 0;
    ReqInfo.Lock.field_2 = (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
    ReqInfo.Render.field_0.Offset64 = 0;
    ReqInfo.Frame = GMM_DISPLAY_BASE;
    ReqInfo._28_4_ = 0;
    ReqInfo.Lock.field_0.Offset64 = 0;
    ReqInfo.MipLevel = 0;
    ReqInfo.Slice = 0;
    ReqInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
    ReqInfo.Plane = GMM_NO_PLANE;
    ReqInfo._0_4_ = 4;
    ReqInfo.ArrayIndex = 0;
    uStack_1f8 = 1;
    (**(code **)(*(long *)ResourceInfo_00 + 0x68))(ResourceInfo_00,&stack0xfffffffffffffe08);
    switch(AlignedHeight) {
    case 0:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 1:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 2:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 3:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
      break;
    case 4:
      CTestResource::GetBppValue((CTestResource *)this,AlignedHeight);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,ResourceInfo_00);
  }
  return;
}

Assistant:

TEST_F(CTestGen12dGPUResource, DISABLED_Test2DTile64MippedResourceOptimization)
{
    const uint32_t HAlign[TEST_BPP_MAX] = {256, 256, 128, 128, 64};
    const uint32_t VAlign[TEST_BPP_MAX] = {256, 128, 128, 64, 64};

    const uint32_t TileSize[TEST_BPP_MAX][2] = {{256, 256},
                                                {512, 128},
                                                {512, 128},
                                                {1024, 64},
                                                {1024, 64}};

    const uint32_t MtsWidth[TEST_BPP_MAX]  = {128, 128, 64, 64, 32};
    const uint32_t MtsHeight[TEST_BPP_MAX] = {256, 128, 128, 64, 64};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    // TiledResource set 0 - allow to enter in Tile64 optimization logic
    gmmParams.Flags.Gpu.TiledResource = 0;
    gmmParams.Flags.Gpu.Texture       = 1;
    gmmParams.MaxLod                  = 5;
    gmmParams.ArraySize               = 4;
    // set any valid Usage
    gmmParams.Usage = GMM_RESOURCE_USAGE_RENDER_TARGET;

    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        uint32_t AlignedWidth    = 0;
        uint32_t AlignedHeight   = 0;
        uint32_t ExpectedPitch   = 0;
        uint32_t MipTailStartLod = 0;
        // Valigned Mip Heights
        uint32_t Mip0Height    = 0;
        uint32_t Mip1Height    = 0;
        uint32_t Mip2Height    = 0;
        uint32_t Mip3Height    = 0;
        uint32_t Mip2Higher    = 0; // Sum of aligned heights of Mip2 and above
        uint32_t MipTailHeight = 0;
        // Haligned Mip Widths
        uint32_t Mip0Width = 0;
        uint32_t Mip1Width = 0;
        uint32_t Mip2Width = 0;

        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x120;
        gmmParams.BaseHeight  = 0x120;
        // TiledResource set 0 - allow to enter in Tile64 optimization logic
        gmmParams.Flags.Gpu.TiledResource = 0;
        gmmParams.Flags.Info.Tile4        = 0;
        gmmParams.Flags.Info.Tile64       = 0;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);
        VerifyResourceTile4<true>(ResourceInfo, true);

        // find the miptail start level
        {
            uint32_t MipWidth  = gmmParams.BaseWidth64;
            uint32_t MipHeight = gmmParams.BaseHeight;
            while(!(MipWidth <= MtsWidth[i] && MipHeight <= MtsHeight[i]))
            {
                MipTailStartLod++;
                MipWidth  = (uint32_t)(GMM_ULT_MAX(1, gmmParams.BaseWidth64 >> MipTailStartLod));
                MipHeight = GMM_ULT_MAX(1, gmmParams.BaseHeight >> MipTailStartLod);
            }
        }

        // Mip resource Aligned Width calculation
        Mip0Width    = GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign[i]);
        Mip1Width    = GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> 1, HAlign[i]);
        Mip2Width    = GMM_ULT_ALIGN(gmmParams.BaseWidth64 >> 2, HAlign[i]);
        AlignedWidth = GMM_ULT_MAX(Mip0Width, Mip1Width + Mip2Width);

        Mip0Height = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign[i]);
        if(MipTailStartLod == 2)
        {
            //EXPECT_EQ(2, ResourceInfo->GetPackedMipTailStartLod());
            // Block height...Mip0Height + Max(Mip1Height, Sum of Mip2Height..MipnHeight)
            Mip1Height = GMM_ULT_ALIGN(gmmParams.BaseHeight >> 1, VAlign[i]);
            Mip2Height = Mip2Higher = GMM_ULT_ALIGN(gmmParams.BaseHeight >> 2, VAlign[i]);
        }
        else if(MipTailStartLod == 3)
        {
            //EXPECT_EQ(3, ResourceInfo->GetPackedMipTailStartLod());
            // Block height...Mip0Height + Max(Mip1Height, Sum of Mip2Height..MipnHeight)
            Mip1Height = GMM_ULT_ALIGN(gmmParams.BaseHeight >> 1, VAlign[i]);
            Mip2Height = GMM_ULT_ALIGN(gmmParams.BaseHeight >> 2, VAlign[i]);
            // Miptail started lod
            MipTailHeight = VAlign[i];
            Mip2Higher    = Mip2Height + MipTailHeight;
        }
        else if(MipTailStartLod == 4)
        {
            //EXPECT_EQ(4, ResourceInfo->GetPackedMipTailStartLod());
            // Block height...Mip0Height + Max(Mip1Height, Sum of Mip2Height..MipnHeight)
            Mip1Height = GMM_ULT_ALIGN(gmmParams.BaseHeight >> 1, VAlign[i]);
            Mip2Height = GMM_ULT_ALIGN(gmmParams.BaseHeight >> 2, VAlign[i]);
            Mip3Height = GMM_ULT_ALIGN(gmmParams.BaseHeight >> 3, VAlign[i]);
            // Miptail started lod
            MipTailHeight = VAlign[i];
            Mip2Higher    = Mip2Height + Mip3Height + MipTailHeight;
        }

        uint32_t MaxHeight = GMM_ULT_MAX(Mip1Height, Mip2Higher);
        AlignedHeight      = Mip0Height + MaxHeight;
        AlignedHeight      = GMM_ULT_ALIGN(AlignedHeight, VAlign[i]);

        ExpectedPitch = AlignedWidth * GetBppValue(bpp);
        ExpectedPitch = GMM_ULT_ALIGN(ExpectedPitch, GMM_BYTES(32));
        //VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch);

        //VerifyResourcePitchInTiles<true>(ResourceInfo, static_cast<uint32_t>(ExpectedPitch / TileSize[i][0]));
        //VerifyResourceSize<true>(ResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * AlignedHeight * gmmParams.ArraySize, PAGE_SIZE));
        //VerifyResourceQPitch<false>(ResourceInfo, AlignedHeight);

        // Mip 0 offsets, offset is 0,0
        GMM_REQ_OFFSET_INFO ReqInfo = {0};
        ReqInfo.MipLevel            = 0;
        ReqInfo.ReqRender           = 1;
        ResourceInfo->GetOffset(ReqInfo);
        uint32_t Mip0Size = ExpectedPitch * Mip0Height;
        //EXPECT_EQ(0, ReqInfo.Render.Offset64);
        //EXPECT_EQ(0, ReqInfo.Render.XOffset);
        //EXPECT_EQ(0, ReqInfo.Render.YOffset);

        // Mip 1 offsets
        ReqInfo           = {0};
        ReqInfo.MipLevel  = 1;
        ReqInfo.ReqRender = 1;
        ResourceInfo->GetOffset(ReqInfo);
        uint32_t Mip1Offset = Mip0Size;
        //EXPECT_EQ(Mip1Offset, ReqInfo.Render.Offset64);
        //EXPECT_EQ(0, ReqInfo.Render.XOffset);
        //EXPECT_EQ(0, ReqInfo.Render.YOffset);

        // Mip 2 offset
        ReqInfo           = {0};
        ReqInfo.MipLevel  = 2;
        ReqInfo.ReqRender = 1;
        ResourceInfo->GetOffset(ReqInfo);
        uint32_t Mip2Offset              = Mip1Width * GetBppValue(bpp) + Mip0Height * ExpectedPitch;
        uint32_t Mip2X                   = GFX_ALIGN_FLOOR(uint32_t(Mip2Offset % ExpectedPitch), TileSize[i][0]);
        uint32_t Mip2Y                   = GFX_ALIGN_FLOOR(uint32_t(Mip2Offset / ExpectedPitch), TileSize[i][1]);
        uint32_t Mip2RenderAlignedOffset = Mip2Y * ExpectedPitch + (Mip2X / TileSize[i][0]) * (TileSize[i][0] * TileSize[i][1]);
        //EXPECT_EQ(Mip2RenderAlignedOffset, ReqInfo.Render.Offset64);
        switch(bpp)
        {
            case TEST_BPP_8:
                //EXPECT_EQ(128, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_16:
                //EXPECT_EQ(256, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_32:
                //EXPECT_EQ(0, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_64:
                //EXPECT_EQ(0, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_128:
                //EXPECT_EQ(0, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            default:
                break;
        }

        // Mip 3 offset
        ReqInfo           = {0};
        ReqInfo.MipLevel  = 3;
        ReqInfo.ReqRender = 1;
        ResourceInfo->GetOffset(ReqInfo);
        uint32_t Mip3Offset = 0;
        switch(bpp)
        {
            case TEST_BPP_8:
                Mip3Offset = Mip1Width * GetBppValue(bpp) + Mip0Height * ExpectedPitch;
                //EXPECT_EQ(0, ReqInfo.Render.XOffset);
                //EXPECT_EQ(128, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_16:
                Mip3Offset = Mip1Width * GetBppValue(bpp) + Mip0Height * ExpectedPitch;
                //EXPECT_EQ(0, ReqInfo.Render.XOffset);
                //EXPECT_EQ(64, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_32:
                Mip3Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + Mip2Height) * ExpectedPitch;
                //EXPECT_EQ(256, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_64:
                Mip3Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + Mip2Height) * ExpectedPitch;
                //EXPECT_EQ(512, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_128:
                Mip3Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + Mip2Height) * ExpectedPitch;
                //EXPECT_EQ(0, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            default:
                break;
        }
        uint32_t Mip3X                   = GFX_ALIGN_FLOOR(uint32_t(Mip3Offset % ExpectedPitch), TileSize[i][0]);
        uint32_t Mip3Y                   = GFX_ALIGN_FLOOR(uint32_t(Mip3Offset / ExpectedPitch), TileSize[i][1]);
        uint32_t Mip3RenderAlignedOffset = Mip3Y * ExpectedPitch + (Mip3X / TileSize[i][0]) * (TileSize[i][0] * TileSize[i][1]);
        //EXPECT_EQ(Mip3RenderAlignedOffset, ReqInfo.Render.Offset64);

        // Mip 4 offset
        ReqInfo           = {0};
        ReqInfo.MipLevel  = 4;
        ReqInfo.ReqRender = 1;
        ResourceInfo->GetOffset(ReqInfo);
        uint32_t Mip4Offset = 0;
        switch(bpp)
        {
            case TEST_BPP_8:
                Mip4Offset = Mip1Width * GetBppValue(bpp) + Mip0Height * ExpectedPitch;
                //EXPECT_EQ(64, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_16:
                Mip4Offset = Mip1Width * GetBppValue(bpp) + Mip0Height * ExpectedPitch;
                //EXPECT_EQ(128, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_32:
                Mip4Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + Mip2Height) * ExpectedPitch;
                //EXPECT_EQ(0, ReqInfo.Render.XOffset);
                //EXPECT_EQ(64, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_64:
                Mip4Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + Mip2Height) * ExpectedPitch;
                //EXPECT_EQ(0, ReqInfo.Render.XOffset);
                //EXPECT_EQ(32, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_128:
                Mip4Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + Mip2Height + Mip3Height) * ExpectedPitch;
                //EXPECT_EQ(512, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            default:
                break;
        }
        uint32_t Mip4X                   = GFX_ALIGN_FLOOR(uint32_t(Mip4Offset % ExpectedPitch), TileSize[i][0]);
        uint32_t Mip4Y                   = GFX_ALIGN_FLOOR(uint32_t(Mip4Offset / ExpectedPitch), TileSize[i][1]);
        uint32_t Mip4RenderAlignedOffset = Mip4Y * ExpectedPitch + (Mip4X / TileSize[i][0]) * (TileSize[i][0] * TileSize[i][1]);
        //EXPECT_EQ(Mip4RenderAlignedOffset, ReqInfo.Render.Offset64);

        // Mip 5 offset
        ReqInfo           = {0};
        ReqInfo.MipLevel  = 4;
        ReqInfo.ReqRender = 1;
        ResourceInfo->GetOffset(ReqInfo);
        uint32_t Mip5Offset = 0;
        switch(bpp)
        {
            case TEST_BPP_8:
                Mip5Offset = Mip1Width * GetBppValue(bpp) + Mip0Height * ExpectedPitch;
                //EXPECT_EQ(64, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_16:
                Mip5Offset = Mip1Width * GetBppValue(bpp) + Mip0Height * ExpectedPitch;
                //EXPECT_EQ(128, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_32:
                Mip5Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + Mip2Height) * ExpectedPitch;
                //EXPECT_EQ(0, ReqInfo.Render.XOffset);
                //EXPECT_EQ(64, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_64:
                Mip5Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + Mip2Height) * ExpectedPitch;
                //EXPECT_EQ(0, ReqInfo.Render.XOffset);
                //EXPECT_EQ(32, ReqInfo.Render.YOffset);
                break;
            case TEST_BPP_128:
                Mip5Offset = Mip1Width * GetBppValue(bpp) + (Mip0Height + Mip2Height + Mip3Height) * ExpectedPitch;
                //EXPECT_EQ(512, ReqInfo.Render.XOffset);
                //EXPECT_EQ(0, ReqInfo.Render.YOffset);
                break;
            default:
                break;
        }
        uint32_t Mip5X                   = GFX_ALIGN_FLOOR(uint32_t(Mip4Offset % ExpectedPitch), TileSize[i][0]);
        uint32_t Mip5Y                   = GFX_ALIGN_FLOOR(uint32_t(Mip4Offset / ExpectedPitch), TileSize[i][1]);
        uint32_t Mip5RenderAlignedOffset = Mip5Y * ExpectedPitch + (Mip5X / TileSize[i][0]) * (TileSize[i][0] * TileSize[i][1]);
        //EXPECT_EQ(Mip5RenderAlignedOffset, ReqInfo.Render.Offset64);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}